

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::emplace<QLinuxFbDevice::Output_const&>
          (QGenericArrayOps<QLinuxFbDevice::Output> *this,qsizetype i,Output *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  Output *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  Output tmp;
  bool local_1f1;
  undefined4 in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1e;
  Output *this_00;
  Output *in_stack_fffffffffffffe40;
  Output *in_stack_fffffffffffffe48;
  Output *in_stack_fffffffffffffe50;
  undefined1 local_178 [368];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QLinuxFbDevice::Output>::needsDetach
                    ((QArrayDataPointer<QLinuxFbDevice::Output> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->kmsOutput).name.d.size) &&
       (qVar3 = QArrayDataPointer<QLinuxFbDevice::Output>::freeSpaceAtEnd
                          ((QArrayDataPointer<QLinuxFbDevice::Output> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe1e,
                                                   CONCAT24(in_stack_fffffffffffffe1c,
                                                            in_stack_fffffffffffffe18)))),
       qVar3 != 0)) {
      QArrayDataPointer<QLinuxFbDevice::Output>::end
                ((QArrayDataPointer<QLinuxFbDevice::Output> *)in_RDI);
      QLinuxFbDevice::Output::Output(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      (in_RDI->kmsOutput).name.d.size = (in_RDI->kmsOutput).name.d.size + 1;
      goto LAB_00122320;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<QLinuxFbDevice::Output>::freeSpaceAtBegin
                          ((QArrayDataPointer<QLinuxFbDevice::Output> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe1e,
                                                   CONCAT24(in_stack_fffffffffffffe1c,
                                                            in_stack_fffffffffffffe18)))),
       qVar3 != 0)) {
      QArrayDataPointer<QLinuxFbDevice::Output>::begin
                ((QArrayDataPointer<QLinuxFbDevice::Output> *)0x1221da);
      QLinuxFbDevice::Output::Output(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      (in_RDI->kmsOutput).name.d.ptr = (char16_t *)((Output *)(in_RDI->kmsOutput).name.d.ptr + -1);
      (in_RDI->kmsOutput).name.d.size = (in_RDI->kmsOutput).name.d.size + 1;
      goto LAB_00122320;
    }
  }
  memcpy(local_178,&DAT_00181d90,0x170);
  QLinuxFbDevice::Output::Output(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  bVar4 = (in_RDI->kmsOutput).name.d.size != 0;
  local_1f1 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  QArrayDataPointer<QLinuxFbDevice::Output>::detachAndGrow
            ((QArrayDataPointer<QLinuxFbDevice::Output> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (Output **)
             CONCAT17(uVar1,CONCAT16(local_1f1,CONCAT24(in_stack_fffffffffffffe1c,uVar2))),
             (QArrayDataPointer<QLinuxFbDevice::Output> *)in_RDI);
  if ((local_1f1 & 1U) == 0) {
    Inserter::Inserter((Inserter *)&stack0xfffffffffffffe38,
                       (QArrayDataPointer<QLinuxFbDevice::Output> *)in_RDI);
    Inserter::insertOne(in_RDX,CONCAT17(uVar1,CONCAT16(local_1f1,
                                                       CONCAT24(in_stack_fffffffffffffe1c,uVar2))),
                        in_RDI);
    Inserter::~Inserter((Inserter *)&stack0xfffffffffffffe38);
  }
  else {
    QArrayDataPointer<QLinuxFbDevice::Output>::begin
              ((QArrayDataPointer<QLinuxFbDevice::Output> *)0x1222aa);
    QLinuxFbDevice::Output::Output(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    (in_RDI->kmsOutput).name.d.ptr = (char16_t *)((Output *)(in_RDI->kmsOutput).name.d.ptr + -1);
    (in_RDI->kmsOutput).name.d.size = (in_RDI->kmsOutput).name.d.size + 1;
  }
  QLinuxFbDevice::Output::~Output(in_stack_fffffffffffffe40);
LAB_00122320:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }